

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O2

void rtext_senditup(_rtext *x,int action,int *widthp,int *heightp,int *indexp)

{
  int iVar1;
  _rtext *p_Var2;
  char *pcVar3;
  short sVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  _glist *in_RAX;
  char *pcVar12;
  t_atom *ptVar13;
  char *pcVar14;
  ulong uVar15;
  t_symbol *ptVar16;
  short sVar17;
  uint uVar18;
  char *pcVar19;
  t_text *ptVar20;
  char *pcVar21;
  char *pcVar22;
  _glist *p_Var23;
  long lVar24;
  char *pcVar25;
  ulong uVar26;
  int *piVar27;
  int iVar28;
  int outchars_b;
  _rtext *local_1c0;
  int local_1b4;
  char *local_1b0;
  int local_1a8;
  int local_1a4;
  int *local_1a0;
  int *local_198;
  _glist *local_190;
  ulong local_188;
  int local_180;
  int local_17c;
  long local_178;
  ulong local_170;
  undefined8 local_168;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int fontheight;
  int fontwidth;
  int guifontsize;
  int *local_130;
  char *local_128;
  int newindex;
  int newheight;
  int newwidth;
  char *local_110;
  char *local_108;
  char smallbuf [200];
  
  outchars_b = 0;
  local_1a0 = heightp;
  local_198 = indexp;
  local_15c = action;
  local_190 = glist_getcanvas(in_RAX);
  text_getfont(x->x_text,x->x_glist,&fontwidth,&fontheight,&guifontsize);
  if (x->x_bufsize < 100) {
    pcVar12 = smallbuf;
  }
  else {
    pcVar12 = (char *)getbytes((ulong)(uint)x->x_bufsize * 2 + 1);
  }
  *pcVar12 = '\0';
  ptVar20 = x->x_text;
  uVar26 = (ulong)(uint)fontheight;
  local_1a4 = fontwidth;
  local_1c0 = x;
  local_1b0 = pcVar12;
  local_188 = uVar26;
  local_130 = widthp;
  if ((~ptVar20->field_0x2e & 3) != 0) {
    local_160 = (int)ptVar20->te_width;
    local_150 = 0x3c;
    if (ptVar20->te_width != 0) {
      local_150 = local_160;
    }
    local_14c = u8_charnum(x->x_buf,x->x_bufsize);
    local_158 = (fontwidth / 2 + *widthp) / fontwidth;
    local_154 = *local_1a0 / fontheight;
    local_1a8 = 0;
    iVar5 = 0;
    local_180 = 0;
    iVar8 = 0;
    iVar10 = 0;
    iVar7 = 0;
    uVar15 = 0;
    while (widthp = local_130, iVar11 = local_150, piVar27 = local_1a0, iVar28 = local_14c - iVar7,
          iVar28 != 0 && iVar7 <= local_14c) {
      iVar1 = local_150;
      if (iVar28 < local_150) {
        iVar1 = iVar28;
      }
      local_148 = x->x_bufsize;
      lVar24 = (long)(int)uVar15;
      local_1b4 = iVar10;
      local_17c = iVar5;
      local_170 = uVar15;
      local_144 = iVar7;
      local_140 = iVar8;
      iVar8 = u8_offset(x->x_buf + lVar24,iVar1);
      pcVar22 = x->x_buf;
      local_128 = pcVar22 + lVar24;
      local_178 = lVar24;
      iVar5 = firstone(local_128,10,iVar8);
      pcVar12 = local_128;
      if (iVar5 < 0) {
        local_168 = 0;
        if (iVar11 < iVar28) {
          iVar5 = lastone(local_128,0x20,iVar8 + 1);
          iVar28 = iVar1;
          if (-1 < iVar5) goto LAB_0014de24;
          goto LAB_0014de42;
        }
        iVar7 = (int)local_170;
        iVar8 = local_148 - iVar7;
      }
      else {
LAB_0014de24:
        iVar28 = u8_charnum(pcVar12,iVar5);
        pcVar22 = local_1c0->x_buf;
        local_168 = 1;
        iVar8 = iVar5;
LAB_0014de42:
        iVar7 = (int)local_170;
      }
      pcVar12 = local_1b0;
      if (local_154 == local_1b4) {
        iVar5 = iVar28;
        if (local_158 < iVar28) {
          iVar5 = local_158;
        }
        if (local_158 < 0) {
          iVar5 = 0;
        }
        iVar5 = u8_offset(pcVar22 + local_178,iVar5);
        *local_198 = iVar5 + iVar7;
        pcVar22 = local_1c0->x_buf;
        local_180 = 1;
      }
      p_Var2 = local_1c0;
      strncpy(pcVar12 + outchars_b,pcVar22 + local_178,(long)iVar8);
      iVar5 = p_Var2->x_selstart;
      iVar10 = (int)local_168;
      if (iVar5 < iVar7) {
        uVar9 = iVar10 + iVar7 + iVar8;
      }
      else {
        uVar9 = iVar10 + iVar7 + iVar8;
        if (iVar5 <= (int)uVar9) {
          local_1a8 = (iVar5 - iVar7) + outchars_b;
        }
      }
      uVar15 = (ulong)uVar9;
      iVar11 = local_1c0->x_selend;
      iVar1 = (iVar11 - iVar7) + outchars_b;
      if ((int)uVar9 < iVar11) {
        iVar1 = local_17c;
      }
      iVar5 = local_17c;
      if (iVar7 <= iVar11) {
        iVar5 = iVar1;
      }
      iVar8 = iVar8 + outchars_b;
      outchars_b = iVar8;
      if ((int)uVar9 < local_1c0->x_bufsize) {
        outchars_b = iVar8 + 1;
        pcVar12[iVar8] = '\n';
      }
      iVar7 = iVar10 + local_144 + iVar28;
      iVar8 = local_140;
      if (local_140 < iVar28) {
        iVar8 = iVar28;
      }
      iVar10 = local_1b4 + 1;
      uVar26 = local_188;
      x = local_1c0;
    }
    if (local_180 == 0) {
      *local_198 = outchars_b;
    }
    iVar7 = local_160;
    if ((short)local_160 == 0) {
      while (iVar7 = iVar8, iVar7 < (int)((uint)((x->x_text->field_0x2e & 3) != 0) * 2 + 1)) {
        lVar24 = (long)outchars_b;
        outchars_b = outchars_b + 1;
        pcVar12[lVar24] = ' ';
        iVar8 = iVar7 + 1;
      }
    }
    *local_130 = iVar7 * local_1a4;
    *local_1a0 = (iVar10 + (uint)(iVar10 == 0)) * (int)uVar26;
    iVar8 = glist_getzoom(x->x_glist);
    if (iVar8 < 2) {
      *widthp = *widthp + 4;
      iVar8 = 5;
    }
    else {
      iVar8 = glist_getzoom(x->x_glist);
      *widthp = *widthp + iVar8 * 4;
      iVar8 = glist_getzoom(x->x_glist);
      iVar8 = iVar8 * 5;
    }
    iVar8 = iVar8 + *piVar27;
    goto LAB_0014e1e9;
  }
  local_1b4 = *widthp / fontwidth;
  *local_198 = 0;
  if (0 < ptVar20->te_width) {
    iVar5 = binbuf_getnatom(ptVar20->te_binbuf);
    ptVar20 = x->x_text;
    if (iVar5 == 1) {
      ptVar13 = binbuf_getvec(ptVar20->te_binbuf);
      ptVar20 = x->x_text;
      if (ptVar13->a_type == A_FLOAT) {
        iVar5 = x->x_bufsize;
        sVar17 = ptVar20->te_width;
        if (sVar17 < iVar5) {
          strncpy(pcVar12,x->x_buf,(long)iVar5);
          pcVar12[x->x_bufsize] = '\0';
          pcVar14 = pcVar12 + x->x_bufsize;
          pcVar19 = pcVar12;
          pcVar22 = pcVar12;
          while( true ) {
            pcVar22 = pcVar22 + 1;
            iVar8 = (int)local_188;
            if (pcVar14 <= pcVar19) break;
            pcVar3 = pcVar22;
            if (*pcVar19 == '.') goto LAB_0014e57d;
            pcVar19 = pcVar19 + 1;
          }
          goto LAB_0014e5b3;
        }
      }
    }
  }
  sVar4 = (short)*(undefined4 *)&ptVar20->te_width;
  sVar17 = 1000;
  if (0 < sVar4) {
    sVar17 = sVar4;
  }
  outchars_b = 0;
  local_178 = CONCAT44(local_178._4_4_,sVar17 + -1);
  iVar5 = fontwidth;
  for (uVar9 = 0;
      (iVar7 = outchars_b, lVar24 = (long)outchars_b, outchars_b < local_1c0->x_bufsize &&
      ((int)uVar9 < (int)sVar17)); uVar9 = uVar9 + 1) {
    uVar6 = u8_nextchar(local_1c0->x_buf,&outchars_b);
    p_Var2 = local_1c0;
    if ((int)uVar9 < local_1b4) {
      *local_198 = outchars_b;
    }
    if ((uVar6 == 10) || (uVar6 == 0)) break;
    pcVar12 = local_1b0 + lVar24;
    memcpy(pcVar12,local_1c0->x_buf + lVar24,outchars_b - lVar24);
    if ((((uint)local_178 == uVar9) && (iVar5 = p_Var2->x_bufsize, outchars_b < iVar5)) &&
       (outchars_b + 1 < iVar5 || p_Var2->x_buf[outchars_b] != ' ')) {
      *pcVar12 = '>';
    }
    iVar5 = local_1a4;
  }
  uVar18 = 3;
  if (3 < uVar9) {
    uVar18 = uVar9;
  }
  sVar17 = local_1c0->x_text->te_width;
  if (0 < sVar17) {
    uVar18 = (int)sVar17;
  }
  *local_130 = uVar18 * iVar5;
  local_1b0[lVar24] = '\0';
  iVar8 = (int)local_188;
  widthp = local_130;
  x = local_1c0;
  pcVar12 = local_1b0;
  outchars_b = iVar7;
  goto LAB_0014e159;
  while (pcVar21 = pcVar19, pcVar3 = pcVar25 + 1, 0xf5 < (byte)(*pcVar19 - 0x3aU)) {
LAB_0014e57d:
    pcVar25 = pcVar3;
    pcVar19 = pcVar19 + 1;
    pcVar21 = pcVar14;
    if (pcVar14 <= pcVar19) break;
  }
  if (pcVar14 <= pcVar25) {
    pcVar25 = pcVar14;
  }
  lVar24 = (long)(iVar5 - sVar17);
  if ((long)pcVar25 - (long)pcVar22 < lVar24) {
LAB_0014e5b3:
    pcVar12[(long)x->x_text->te_width + -1] = '>';
    pcVar12[x->x_text->te_width] = '\0';
  }
  else {
    for (; pcVar21 < pcVar14; pcVar21 = pcVar21 + 1) {
      pcVar21[-lVar24] = *pcVar21;
    }
  }
  outchars_b = (int)x->x_text->te_width;
  *local_198 = local_1b4;
  *widthp = local_1a4 * outchars_b;
LAB_0014e159:
  piVar27 = local_1a0;
  iVar5 = *local_198;
  iVar7 = outchars_b;
  if (iVar5 < outchars_b) {
    iVar7 = iVar5;
  }
  if (outchars_b < iVar5 || iVar7 < 0) {
    iVar5 = 0;
    if (0 < iVar7) {
      iVar5 = iVar7;
    }
    *local_198 = iVar5;
  }
  local_1a8 = x->x_selstart;
  iVar5 = x->x_selend;
  iVar7 = glist_getzoom(x->x_glist);
  *widthp = *widthp + iVar7 * 2;
  iVar7 = glist_getzoom(x->x_glist);
  iVar8 = iVar8 + iVar7 * 4;
LAB_0014e1e9:
  iVar7 = local_15c;
  *piVar27 = iVar8;
  pcVar12[outchars_b] = '\0';
  if (local_15c != 0) {
    ptVar20 = x->x_text;
    sVar17 = ptVar20->te_width;
    if ((sVar17 != 0) && ((~ptVar20->field_0x2e & 3) != 0)) {
      _newwidth = (char *)((ulong)_newwidth & 0xffffffff00000000);
      newheight = 0;
      newindex = 0;
      ptVar20->te_width = 0;
      rtext_senditup(x,0,&newwidth,&newheight,&newindex);
      piVar27 = local_1a0;
      if (newwidth != *widthp) {
        x->x_text->te_width = sVar17;
      }
    }
    if ((local_190->field_0xe8 & 1) != 0) {
      if (iVar7 == 2) {
        pcVar12 = x->x_tag;
        pdgui_vmess("pdtk_text_set","cs s",local_190,pcVar12,local_1b0);
        if ((*widthp != x->x_drawnwidth) || (*piVar27 != x->x_drawnheight)) {
          text_drawborder(x->x_text,x->x_glist,pcVar12,*widthp,*piVar27,0);
        }
        p_Var23 = local_190;
        iVar8 = local_1a8;
        if (x->x_active != 0) {
          if (local_1a8 < iVar5) {
            uVar9 = u8_charnum(x->x_buf,local_1a8);
            p_Var23 = local_190;
            pdgui_vmess((char *)0x0,"crr si",local_190,"select","from",pcVar12,(ulong)uVar9);
            iVar5 = u8_charnum(local_1c0->x_buf,iVar5);
            x = local_1c0;
            pdgui_vmess((char *)0x0,"crr si",p_Var23,"select","to",pcVar12,(ulong)(iVar5 - 1));
            pcVar12 = "";
          }
          else {
            pdgui_vmess((char *)0x0,"crr",local_190,"select","clear");
            uVar9 = u8_charnum(x->x_buf,iVar8);
            pdgui_vmess((char *)0x0,"cr si",p_Var23,"icursor",pcVar12,(ulong)uVar9);
            pdgui_vmess("focus","c",p_Var23);
          }
          pdgui_vmess((char *)0x0,"crs",p_Var23,"focus",pcVar12);
        }
      }
      else if (iVar7 == 1) {
        _newwidth = x->x_tag;
        ptVar16 = gensym(&DAT_001a8378 +
                         *(int *)(&DAT_001a8378 + (ulong)((byte)x->x_text->field_0x2e & 3) * 4));
        local_110 = ptVar16->s_name;
        local_108 = "text";
        iVar5 = glist_getzoom(x->x_glist);
        if (iVar5 < 2) {
          iVar5 = 3;
          iVar8 = 2;
        }
        else {
          iVar8 = glist_getzoom(x->x_glist);
          iVar8 = iVar8 * 2;
          iVar5 = glist_getzoom(x->x_glist);
          iVar5 = iVar5 * 3;
        }
        pcVar12 = local_1b0;
        iVar7 = text_xpix(x->x_text,x->x_glist);
        iVar10 = text_ypix(x->x_text,x->x_glist);
        iVar11 = glist_isselected(local_1c0->x_glist,&local_1c0->x_text->te_g);
        x = local_1c0;
        pcVar22 = "blue";
        if (iVar11 == 0) {
          pcVar22 = "black";
        }
        pdgui_vmess("pdtk_text_new","c S ii s i r",local_190,3,&newwidth,
                    (ulong)(uint)(iVar8 + iVar7),(ulong)(uint)(iVar10 + iVar5),pcVar12,
                    (ulong)(uint)guifontsize,pcVar22);
      }
    }
  }
  x->x_drawnwidth = *widthp;
  x->x_drawnheight = *piVar27;
  if (local_1b0 != smallbuf) {
    freebytes(local_1b0,(long)x->x_bufsize * 2 + 1);
  }
  return;
}

Assistant:

static void rtext_senditup(t_rtext *x, int action, int *widthp, int *heightp,
    int *indexp)
{
    char smallbuf[200], *tempbuf;
    int outchars_b = 0, guifontsize, fontwidth, fontheight;
    t_canvas *canvas = glist_getcanvas(x->x_glist);
    int selstart_b, selend_b;   /* beginning and end of selection in bytes */
        /* if we're a GOP (the new, "goprect" style) borrow the font size
        from the inside to preserve the spacing */

    text_getfont(x->x_text, x->x_glist, &fontwidth, &fontheight, &guifontsize);
    if (x->x_bufsize >= 100)
         tempbuf = (char *)t_getbytes(2 * x->x_bufsize + 1);
    else tempbuf = smallbuf;
    tempbuf[0] = 0;

    if (x->x_text->te_type == T_ATOM)
        rtext_formatatom(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b,  &selend_b,
            fontwidth, fontheight);
    else rtext_formattext(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b, &selend_b,
            fontwidth, fontheight);
    tempbuf[outchars_b]=0;

    if (action && x->x_text->te_width && x->x_text->te_type != T_ATOM)
    {
            /* if our width is specified but the "natural" width is the
            same as the specified width, set specified width to zero
            so future text editing will automatically change width.
            Except atoms whose content changes at runtime. */
        int widthwas = x->x_text->te_width, newwidth = 0, newheight = 0,
            newindex = 0;
        x->x_text->te_width = 0;
        rtext_senditup(x, 0, &newwidth, &newheight, &newindex);
        if (newwidth != *widthp)
            x->x_text->te_width = widthwas;
    }

    if (action && !canvas->gl_havewindow)
        action = 0;

    if (action == SEND_FIRST)
    {
        const char *tags[] = {x->x_tag, rtext_gettype(x)->s_name, "text"};
        int lmargin = LMARGIN, tmargin = TMARGIN;
        if (glist_getzoom(x->x_glist) > 1)
        {
            /* zoom margins */
            lmargin *= glist_getzoom(x->x_glist);
            tmargin *= glist_getzoom(x->x_glist);
        }
            /* we add an extra space to the string just in case the last
            character is an unescaped backslash ('\') which would have confused
            tcl/tk by escaping the close brace otherwise.  The GUI code
            drops the last character in the string. */
        pdgui_vmess("pdtk_text_new", "c S ii s i r",
            canvas,
            3, tags,
            text_xpix(x->x_text, x->x_glist) + lmargin, text_ypix(x->x_text, x->x_glist) + tmargin,
            tempbuf,
            guifontsize,
            (glist_isselected(x->x_glist, &x->x_text->te_g)? "blue" : "black"));
    }
    else if (action == SEND_UPDATE)
    {
        pdgui_vmess("pdtk_text_set", "cs s",
                  canvas, x->x_tag,
                  tempbuf);
        if (*widthp != x->x_drawnwidth || *heightp != x->x_drawnheight)
            text_drawborder(x->x_text, x->x_glist, x->x_tag,
                *widthp, *heightp, 0);
        if (x->x_active)
        {
            if (selend_b > selstart_b)
            {
                pdgui_vmess(0, "crr si",
                    canvas, "select", "from",
                    x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess(0, "crr si",
                    canvas, "select", "to",
                    x->x_tag, u8_charnum(x->x_buf, selend_b) - 1);
                pdgui_vmess(0, "crs", canvas, "focus", "");
            }
            else
            {
                pdgui_vmess(0, "crr", canvas, "select", "clear");
                pdgui_vmess(0, "cr si", canvas, "icursor", x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess("focus", "c", canvas);
                pdgui_vmess(0, "crs", canvas, "focus", x->x_tag);
            }
        }
    }
    x->x_drawnwidth = *widthp;
    x->x_drawnheight = *heightp;

    if (tempbuf != smallbuf)
        t_freebytes(tempbuf, 2 * x->x_bufsize + 1);
}